

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

sysbvm_tuple_t sysbvm_arrayOrByteArray_at(sysbvm_tuple_t array,size_t index)

{
  _Bool _Var1;
  size_t sVar2;
  size_t size_1;
  size_t size;
  size_t index_local;
  sysbvm_tuple_t array_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(array);
  if (_Var1) {
    _Var1 = sysbvm_tuple_isBytes(array);
    if (_Var1) {
      sVar2 = sysbvm_tuple_getSizeInBytes(array);
      if (sVar2 <= index) {
        sysbvm_error_indexOutOfBounds();
      }
      array_local = sysbvm_tuple_uint8_encode(*(uint8_t *)(array + 0x10 + index));
    }
    else {
      sVar2 = sysbvm_tuple_getSizeInSlots(array);
      if (sVar2 <= index) {
        sysbvm_error_indexOutOfBounds();
      }
      array_local = *(sysbvm_tuple_t *)(array + 0x10 + index * 8);
    }
  }
  else {
    array_local = 0;
  }
  return array_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_arrayOrByteArray_at(sysbvm_tuple_t array, size_t index)
{
    if(!sysbvm_tuple_isNonNullPointer(array)) return SYSBVM_NULL_TUPLE;

    if(sysbvm_tuple_isBytes(array))
    {
        size_t size = sysbvm_tuple_getSizeInBytes(array);
        if(index >= size) sysbvm_error_indexOutOfBounds();
        return sysbvm_tuple_uint8_encode(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(array)->bytes[index]);
    }
    else
    {
        size_t size = sysbvm_tuple_getSizeInSlots(array);
        if(index >= size) sysbvm_error_indexOutOfBounds();
        return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(array)->pointers[index];
    }
}